

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O0

void printKTXInfo2(ktxStream *stream,KTX_header *pHeader)

{
  ktx_error_code_e kVar1;
  void *__ptr;
  long in_RSI;
  undefined8 *in_RDI;
  ktx_uint32_t lodSize;
  ktx_uint32_t faceLodSize;
  uint32_t level;
  ktx_uint64_t dataSize;
  _Bool nonArrayCubemap;
  uint32_t levelCount;
  ktx_error_code_e result;
  KTX_supplemental_info suppInfo;
  ktx_uint8_t *metadata;
  uint local_44;
  uint local_3c;
  uint local_38;
  uint local_34;
  KTX_supplemental_info *in_stack_ffffffffffffffd0;
  long lVar2;
  undefined4 in_stack_ffffffffffffffd8;
  uint uVar3;
  undefined4 in_stack_ffffffffffffffdc;
  
  if (*(int *)(in_RSI + 0xc) == 0x1020304) {
    fprintf(_stdout,
            "This file has opposite endianness to this machine. Following\nare the converted pHeader values\n\n"
           );
  }
  else {
    fprintf(_stdout,"Header\n\n");
  }
  printKTXHeader((KTX_header *)0x3f1f98);
  kVar1 = ktxCheckHeader1_((KTX_header *)
                           CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                           in_stack_ffffffffffffffd0);
  if (kVar1 == KTX_SUCCESS) {
    if (*(int *)(in_RSI + 0x3c) == 0) {
      fprintf(_stdout,"\nNo Key/Value data.\n");
    }
    else {
      fprintf(_stdout,"\nKey/Value Data\n\n");
      __ptr = malloc((ulong)*(uint *)(in_RSI + 0x3c));
      (*(code *)*in_RDI)(in_RDI,__ptr,*(undefined4 *)(in_RSI + 0x3c));
      printKVData(_faceLodSize,lodSize);
      free(__ptr);
    }
    if (*(int *)(in_RSI + 0x38) == 0) {
      local_44 = 1;
    }
    else {
      local_44 = *(uint *)(in_RSI + 0x38);
    }
    if ((*(int *)(in_RSI + 0x30) == 0) && (*(int *)(in_RSI + 0x34) == 6)) {
      uVar3 = 0x1000000;
    }
    else {
      uVar3 = 0;
    }
    lVar2 = 0;
    fprintf(_stdout,"\nData Sizes (bytes)\n------------------\n");
    for (local_34 = 0; local_34 < local_44; local_34 = local_34 + 1) {
      (*(code *)*in_RDI)(in_RDI,&local_38,4);
      if (*(int *)(in_RSI + 0xc) == 0x1020304) {
        _ktxSwapEndian32(&local_38,1);
      }
      if ((uVar3 & 0x1000000) == 0) {
        local_3c = local_38;
      }
      else {
        local_3c = local_38 * 6;
      }
      (*(code *)in_RDI[1])(in_RDI,local_3c);
      lVar2 = (ulong)local_3c + lVar2;
      fprintf(_stdout,"Level %u: %u\n",(ulong)local_34,(ulong)local_3c);
    }
    fprintf(_stdout,"\nTotal: %ld\n",lVar2);
  }
  else {
    fprintf(_stdout,"The KTX 1 file pHeader is invalid:\n");
    if (kVar1 == KTX_FILE_DATA_ERROR) {
      fprintf(_stdout,
              "  it has invalid data such as bad glTypeSize, improper dimensions,\nimproper number of faces or too many levels.\n"
             );
    }
    else if (kVar1 == KTX_UNSUPPORTED_FEATURE) {
      fprintf(_stdout,"  it describes an unsupported feature or format\n");
    }
  }
  return;
}

Assistant:

void
printKTXInfo2(ktxStream* stream, KTX_header* pHeader)
{
    ktx_uint8_t* metadata;
    KTX_supplemental_info suppInfo;
    KTX_error_code result;

    if (pHeader->endianness == KTX_ENDIAN_REF_REV) {
        fprintf(stdout, "This file has opposite endianness to this machine. Following\n"
                        "are the converted pHeader values\n\n");
    } else {
        fprintf(stdout, "Header\n\n");
    }
    // Print first as ktxCheckHeader1_ modifies the header.
    printKTXHeader(pHeader);

    result = ktxCheckHeader1_(pHeader, &suppInfo);
    if (result != KTX_SUCCESS) {
        fprintf(stdout, "The KTX 1 file pHeader is invalid:\n");
        switch (result) {
          case KTX_FILE_DATA_ERROR:
            fprintf(stdout, "  it has invalid data such as bad glTypeSize, improper dimensions,\n"
                            "improper number of faces or too many levels.\n");
            break;
          case KTX_UNSUPPORTED_FEATURE:
            fprintf(stdout, "  it describes an unsupported feature or format\n");
            break;
          default:
              ; // _ktxCheckHeader returns only the above 2 errors.
        }
        return;
    }

    if (pHeader->bytesOfKeyValueData) {
        fprintf(stdout, "\nKey/Value Data\n\n");
        metadata = malloc(pHeader->bytesOfKeyValueData);
        stream->read(stream, metadata, pHeader->bytesOfKeyValueData);
        printKVData(metadata, pHeader->bytesOfKeyValueData);
        free(metadata);
    } else {
        fprintf(stdout, "\nNo Key/Value data.\n");
    }

    uint32_t levelCount = MAX(1, pHeader->numberOfMipLevels);
    bool nonArrayCubemap;
    if (pHeader->numberOfArrayElements == 0 && pHeader->numberOfFaces == 6)
        nonArrayCubemap = true;
    else
        nonArrayCubemap = false;
    ktx_uint64_t dataSize = 0;
    // A note about padding: Since KTX requires a row alignment of 4 for
    // uncompressed and all block-compressed formats have block sizes that
    // are a multiple of 4, all levels and faces will also be a multiple
    // of 4 so mipPadding and facePadding will always be 0. So they are
    // ignored here.
    fprintf(stdout, "\nData Sizes (bytes)\n------------------\n");
    for (uint32_t level = 0; level < levelCount; level++) {
        ktx_uint32_t faceLodSize;
        ktx_uint32_t lodSize;
        result = stream->read(stream, &faceLodSize, sizeof(ktx_uint32_t));
        if (pHeader->endianness == KTX_ENDIAN_REF_REV)
            _ktxSwapEndian32(&faceLodSize, 1);
        if (nonArrayCubemap) {
            lodSize = faceLodSize * 6;
        } else {
            lodSize = faceLodSize;
        }
        result = stream->skip(stream, lodSize);
        dataSize += lodSize;
        fprintf(stdout, "Level %u: %u\n", level, lodSize);
    }
    fprintf(stdout, "\nTotal: %" PRId64 "\n", dataSize);
}